

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTArithmeticExpression.cpp
# Opt level: O0

String * MathML::AST::ArithmeticExpression::operatorString_abi_cxx11_(Operator op)

{
  Operator op_local;
  String *local_8;
  
  switch(op) {
  case ADD:
    local_8 = (String *)OPERATOR_ARITHMETIC_ADD_abi_cxx11_;
    break;
  case SUB:
    local_8 = (String *)OPERATOR_ARITHMETIC_SUB_abi_cxx11_;
    break;
  case MUL:
    local_8 = (String *)OPERATOR_ARITHMETIC_MUL_abi_cxx11_;
    break;
  case DIV:
    local_8 = (String *)OPERATOR_ARITHMETIC_DIV_abi_cxx11_;
    break;
  default:
    local_8 = (String *)OPERATOR_ARITHMETIC_ILLEGAL_abi_cxx11_;
  }
  return local_8;
}

Assistant:

const String& ArithmeticExpression::operatorString( Operator op )
        {
            switch ( op )
            {

            case ADD:
                return OPERATOR_ARITHMETIC_ADD;

            case SUB:
                return OPERATOR_ARITHMETIC_SUB;

            case MUL:
                return OPERATOR_ARITHMETIC_MUL;

            case DIV:
                return OPERATOR_ARITHMETIC_DIV;
            }

            return OPERATOR_ARITHMETIC_ILLEGAL;
        }